

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O2

MPP_RET hal_h265e_vepu511_gen_regs(void *hal,HalEncTask *task)

{
  byte bVar1;
  byte bVar2;
  RK_U8 RVar3;
  RK_U8 RVar4;
  ushort uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  void *__s;
  long lVar8;
  EncRcTask *pEVar9;
  void *pvVar10;
  MppBuffer buffer;
  MppDevRegOffCfgs *pMVar11;
  EncRcTask *pEVar12;
  undefined1 auVar13 [12];
  byte bVar14;
  uint uVar15;
  undefined4 uVar16;
  int iVar17;
  RK_U32 RVar18;
  RK_U32 RVar19;
  MppFrameFormat MVar20;
  int iVar21;
  MPP_RET MVar22;
  HalBuf *pHVar23;
  HalBuf *pHVar24;
  size_t sVar25;
  byte *pbVar26;
  ulong uVar27;
  uint *puVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  RK_U32 *pRVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  Vepu511ControlCfg *reg_ctl;
  ushort uVar45;
  MppBuffer *buffer_00;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 uVar49;
  undefined1 auVar48 [16];
  
  __s = *(void **)(*(long *)((long)hal + 0x90) + 0x18);
  lVar8 = *(long *)((long)hal + 0x3c0);
  puVar28 = *(uint **)((long)hal + 0x3e0);
  pEVar9 = task->rc_task;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x888);
  }
  if ((hal_h265e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","frame %d | type %d | start gen regs11",
               "hal_h265e_vepu511_gen_regs",(ulong)*(uint *)((long)hal + 0x3fc),
               (ulong)*(uint *)((long)hal + 0x374));
  }
  uVar44 = 0;
  memset(__s,0,0x18d0);
  *(uint *)((long)__s + 0x10) = (*(uint *)((long)hal + 0x3d0) & 7) << 8;
  *(undefined4 *)((long)__s + 0x14) = 0;
  *(undefined4 *)((long)__s + 0x20) = 0x7fff;
  *(undefined4 *)((long)__s + 0x28) = 1;
  *(undefined8 *)((long)__s + 0x30) = 0x3ff000000007007;
  *(undefined4 *)((long)__s + 0x38) = 0;
  *(undefined8 *)((long)__s + 0x54) = 5;
  pvVar10 = (task->syntax).data;
  iVar17 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x1864);
  uVar31 = 0;
  uVar15 = 1;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x364);
    uVar31 = *(uint *)((long)__s + 0x1c4) & 0xf800f800;
    uVar44 = *(uint *)((long)__s + 0x1c8) & 0xffffffc0;
    uVar15 = (*(uint *)((long)__s + 0x1b4) & 0xfffffffc) + 1;
  }
  uVar45 = *(ushort *)((long)pvVar10 + 4);
  uVar5 = *(ushort *)((long)pvVar10 + 6);
  *(uint *)((long)__s + 0x1c4) =
       (uint)uVar5 * 0x2000 + 0x7ffe000 & 0x7ff0000 | uVar31 | (uVar45 + 7 >> 3) - 1 & 0x7ff;
  uVar32 = *(ushort *)((long)pvVar10 + 4) & 7;
  uVar31 = 8 - uVar32;
  if ((*(ushort *)((long)pvVar10 + 4) & 7) == 0) {
    uVar31 = uVar32;
  }
  *(uint *)((long)__s + 0x1c8) = uVar31 | uVar44;
  uVar33 = *(ushort *)((long)pvVar10 + 6) & 7;
  uVar32 = (8 - uVar33) * 0x10000;
  if ((*(ushort *)((long)pvVar10 + 6) & 7) == 0) {
    uVar32 = uVar33;
  }
  *(uint *)((long)__s + 0x1c8) = (uVar31 | uVar44) & 0xffc0ffcf | uVar32;
  *(uint *)((long)__s + 0x1b4) = uVar15;
  *(uint *)((long)__s + 0x1b4) =
       (uVar15 & 0xffffffe9) + (uint)(*(int *)((long)pvVar10 + 0x120) == 0) * 4 + 0x10;
  uVar15 = mpp_log2((uVar45 + 0x1f >> 4 & 0xfffffffe) * (uVar5 + 0x1f >> 5) - 2);
  uVar31 = (uVar15 & 0x1f) << 0x13;
  uVar15 = *(uint *)((long)__s + 0x1b4);
  *(uint *)((long)__s + 0x1b4) = uVar15 & 0xff07ffff | uVar31;
  uVar44 = (uint)(iVar17 == 1) * 3 + 6;
  if (*(int *)((long)hal + 0x374) == 2) {
    uVar44 = 6;
  }
  *(uint *)((long)__s + 0x46c) = *(uint *)((long)__s + 0x46c) & 0xfffffff0 | uVar44;
  *(uint *)((long)__s + 0x1b4) = uVar15 & 0x7e07ffff | uVar31;
  uVar15 = *(uint *)((long)__s + 0x254);
  *(uint *)((long)__s + 0x254) = uVar15 & 0xffff8003 | 0x2d0;
  *(uint *)((long)__s + 600) = *(uint *)((long)__s + 600) & 0xffffff00 | 0x55;
  uVar31 = uVar15 & 0xff7f8000 | 0x2d0;
  uVar15 = uVar31 + 2;
  if (*(char *)((long)pvVar10 + 0x1e) == '\0') {
    uVar15 = uVar31;
  }
  *(uint *)((long)__s + 0x254) = uVar15 | 0x800000;
  *(uint *)((long)__s + 0x254) =
       uVar15 & 0xfcff82d2 | 0x800000 | (*(uint *)((long)pvVar10 + 0x24) & 1) << 0x18;
  uVar15 = 1;
  if (*(int *)((long)hal + 0x374) == 2) {
    uVar15 = 0x13;
  }
  *(uint *)((long)__s + 0x264) = *(uint *)((long)__s + 0x264) & 0xffffffc0 | uVar15;
  *(uint *)((long)__s + 0x228) = *(uint *)((long)__s + 0x228) & 0x88000000 | 0xf20048;
  *(undefined4 *)((long)__s + 0x224) = 0x1ccff;
  if (((*(byte *)(lVar8 + 0x26) & 4) != 0) && (*(int *)((long)hal + 0x374) != 2)) {
    uVar15 = 0xc0000000;
    if (*(int *)((long)hal + 0x21c) == 2) {
      uVar15 = 0x40000000;
    }
    *(uint *)((long)__s + 0x22c) = uVar15 | *(uint *)((long)__s + 0x22c) & 0x3fffffff;
  }
  *(uint *)((long)__s + 0x22c) = *(uint *)((long)__s + 0x22c) & 0xcfffe000 | 0x40;
  *(ulong *)((long)__s + 0x5b4) =
       *(ulong *)((long)__s + 0x5b4) & 0xe0080200ffff000c | (ulong)DAT_002ad680;
  uVar15 = *(uint *)((long)__s + 0x5bc) & 0xfff00000;
  *(uint *)((long)__s + 0x5bc) = uVar15 + 0x88010;
  *(undefined4 *)((long)__s + 0x5c0) = 0x14100c08;
  auVar46 = *(undefined1 (*) [16])((long)__s + 0x5c4) & _DAT_002a00c0;
  auVar47 = _DAT_002a00d0 | auVar46;
  *(undefined1 (*) [16])((long)__s + 0x5c4) = auVar47;
  if (*(int *)(*(long *)((long)hal + 0x3b0) + 0x1864) == 1) {
    uVar16 = 0xc080604;
    if (*(int *)((long)hal + 0x414) != 0) goto LAB_00250e2c;
  }
  else {
    *(uint *)((long)__s + 0x5bc) = uVar15 | 0x88000;
    *(int *)((long)__s + 0x5c8) = auVar46._4_4_;
    uVar16 = 0x4040404;
LAB_00250e2c:
    *(undefined4 *)((long)__s + 0x5c0) = uVar16;
  }
  *(int *)((long)__s + 0x5c4) = auVar47._0_4_;
  *(int *)((long)__s + 0x5cc) = auVar46._8_4_;
  lVar30 = *(long *)((long)hal + 0x3b0);
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","enter\n","vepu511_h265_set_split");
  }
  iVar17 = *(int *)(lVar30 + 0xe94);
  if (iVar17 == 2) {
    *(uint *)((long)__s + 0x214) = *(uint *)((long)__s + 0x214) & 0x80007ff8 | 0x1f48003;
    *(uint *)((long)__s + 0x21c) =
         *(uint *)((long)__s + 0x21c) & 0xfff00000 | *(int *)(lVar30 + 0xe98) - 1U & 0xfffff;
    *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xfff00000;
LAB_00250f43:
    *(uint *)((long)__s + 0x1b4) =
         *(uint *)((long)__s + 0x1b4) & 0xbfffffff | (uint)(*(int *)(lVar30 + 0xe9c) != 0) << 0x1e;
    *(uint *)((long)__s + 0x20) =
         (*(uint *)((long)__s + 0x20) & 0xfffffff7) + (uint)(*(int *)(lVar30 + 0xe9c) != 0) * 8;
  }
  else {
    if (iVar17 == 1) {
      *(uint *)((long)__s + 0x214) = *(uint *)((long)__s + 0x214) & 0x80007ff8 | 0x1f48001;
      *(uint *)((long)__s + 0x21c) = *(uint *)((long)__s + 0x21c) & 0xfff00000;
      *(uint *)((long)__s + 0x218) =
           *(uint *)((long)__s + 0x218) & 0xfff00000 | *(uint *)(lVar30 + 0xe98) & 0xfffff;
      goto LAB_00250f43;
    }
    if (iVar17 == 0) {
      *(uint *)((long)__s + 0x21c) = *(uint *)((long)__s + 0x21c) & 0xfff00000;
      *(ulong *)((long)__s + 0x214) = *(ulong *)((long)__s + 0x214) & 0xfff0000080007ff8;
      *(byte *)((long)__s + 0x1b7) = *(byte *)((long)__s + 0x1b7) & 0xbf;
    }
    else {
      _mpp_log_l(4,"hal_h265e_v511","invalide slice split mode %d\n","vepu511_h265_set_split");
    }
  }
  *(undefined4 *)(lVar30 + 0xe90) = 0;
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","leave\n","vepu511_h265_set_split");
  }
  buffer = task->md_info;
  lVar30 = *(long *)((long)hal + 0x90);
  lVar29 = *(long *)((long)hal + 0x3c0);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x445);
  }
  iVar17 = mpp_buffer_get_fd_with_caller(task->input,"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x134) = iVar17;
  *(int *)((long)__s + 0x138) = iVar17;
  *(int *)((long)__s + 0x13c) = iVar17;
  pHVar23 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x400),*(RK_S32 *)(lVar30 + 0x10));
  pHVar24 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x400),*(RK_S32 *)(lVar30 + 0x14));
  if (*(int *)(lVar29 + 0x120) == 0) {
    iVar17 = mpp_buffer_get_fd_with_caller(*pHVar23->buf,"vepu511_h265_set_hw_address");
    *(int *)((long)__s + 0x140) = iVar17;
    *(int *)((long)__s + 0x144) = iVar17;
    mpp_dev_multi_offset_update
              (*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xa4,*(RK_U32 *)((long)hal + 0x408));
  }
  iVar17 = mpp_buffer_get_fd_with_caller(*pHVar24->buf,"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x148) = iVar17;
  *(int *)((long)__s + 0x14c) = iVar17;
  iVar17 = mpp_buffer_get_fd_with_caller(pHVar23->buf[2],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x150) = iVar17;
  iVar17 = mpp_buffer_get_fd_with_caller(pHVar24->buf[2],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x154) = iVar17;
  iVar17 = mpp_buffer_get_fd_with_caller(pHVar23->buf[1],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x158) = iVar17;
  iVar17 = mpp_buffer_get_fd_with_caller(pHVar24->buf[1],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x15c) = iVar17;
  mpp_dev_multi_offset_update
            (*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xa6,*(RK_U32 *)((long)hal + 0x408));
  if (buffer == (MppBuffer)0x0) {
    *(uint *)((long)__s + 0x1b4) = *(uint *)((long)__s + 0x1b4) & 0xfffffff7;
    iVar17 = 0;
  }
  else {
    *(uint *)((long)__s + 0x1b4) = *(uint *)((long)__s + 0x1b4) | 8;
    iVar17 = mpp_buffer_get_fd_with_caller(buffer,"vepu511_h265_set_hw_address");
  }
  *(int *)((long)__s + 0x160) = iVar17;
  iVar17 = mpp_buffer_get_fd_with_caller(task->output,"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x164) = iVar17;
  *(int *)((long)__s + 0x168) = iVar17;
  *(int *)((long)__s + 0x16c) = iVar17;
  *(int *)((long)__s + 0x170) = iVar17;
  *(undefined8 *)((long)__s + 0x184) = 0xffffffff;
  *(undefined8 *)((long)__s + 0x18c) = 0xffffffff;
  *(undefined4 *)((long)__s + 0x19c) = 0;
  pMVar11 = *(MppDevRegOffCfgs **)((long)hal + 0x3b8);
  sVar25 = mpp_packet_get_length(task->packet);
  mpp_dev_multi_offset_update(pMVar11,0xae,(RK_U32)sVar25);
  pMVar11 = *(MppDevRegOffCfgs **)((long)hal + 0x3b8);
  sVar25 = mpp_buffer_get_size_with_caller(task->output,"vepu511_h265_set_hw_address");
  mpp_dev_multi_offset_update(pMVar11,0xac,(RK_U32)sVar25);
  RVar18 = mpp_frame_get_offset_y(task->frame);
  *(uint *)((long)__s + 0x1e4) =
       *(uint *)((long)__s + 0x1e4) & 0xc000ffff | (RVar18 & 0x3fff) << 0x10;
  RVar18 = mpp_frame_get_offset_x(task->frame);
  *(uint *)((long)__s + 0x1e4) = *(uint *)((long)__s + 0x1e4) & 0xffffc000 | RVar18 & 0x3fff;
  iVar17 = mpp_buffer_get_fd_with_caller(pHVar24->buf[3],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x194) = iVar17;
  iVar17 = mpp_buffer_get_fd_with_caller(pHVar23->buf[3],"vepu511_h265_set_hw_address");
  *(int *)((long)__s + 0x198) = iVar17;
  lVar30 = *(long *)((long)hal + 0x3b0);
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xffffff0f | (puVar28[4] & 0xf) << 4;
  uVar31 = *puVar28;
  uVar44 = (*(uint *)((long)__s + 0x1cc) & 0xffffffc3) + (uVar31 & 0xf) * 4;
  *(uint *)((long)__s + 0x1cc) = uVar44;
  uVar15 = puVar28[1];
  *(uint *)((long)__s + 0x1cc) = uVar44 & 0xfffffffe | uVar15 & 1;
  uVar15 = (uVar44 & 0xfffffffc | uVar15 & 1) + (puVar28[2] & 1) * 2;
  *(uint *)((long)__s + 0x1cc) = uVar15;
  *(uint *)((long)__s + 0x1cc) = uVar15 & 0xffffff7f | (uint)(*(int *)(lVar30 + 0x24) != 0xc) << 7;
  uVar44 = (uint)(0 < *(int *)(lVar30 + 0x58)) << 0x1a;
  uVar15 = *(uint *)((long)__s + 0x1e0);
  *(uint *)((long)__s + 0x1e0) = uVar15 & 0xfbffffff | uVar44;
  uVar15 = uVar15 & 0xe3ffffff | uVar44 | (*(uint *)(lVar30 + 0x50) & 3) << 0x1b;
  *(uint *)((long)__s + 0x1e0) = uVar15;
  if ((*(byte *)(lVar30 + 0x26) & 0xf0) == 0) {
    RVar18 = *(RK_U32 *)(lVar30 + 0x14);
    if (RVar18 == 0) {
      RVar18 = 0;
      switch(uVar31 & 0xf) {
      case 0:
        RVar18 = *(int *)(lVar30 + 0xc) << 2;
        break;
      case 1:
        RVar18 = *(int *)(lVar30 + 0xc) * 3;
        break;
      case 2:
      case 8:
      case 9:
        RVar18 = *(int *)(lVar30 + 0xc) * 2;
      }
    }
  }
  else {
    *(uint *)((long)__s + 0x1e0) = uVar15 | 0x40000000;
    RVar18 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (RVar18 == 0) {
      RVar18 = *(int *)(lVar30 + 0x14) + 0x3f >> 2 & 0xfffffff0;
    }
  }
  uVar15 = 6;
  RVar19 = RVar18;
  switch(*puVar28) {
  case 4:
  case 6:
  case 0xd:
    break;
  default:
    RVar19 = (int)RVar18 / 2;
    break;
  case 0xc:
    RVar19 = RVar18 * 2;
  }
  if ((*(uint *)((long)__s + 0x1cc) & 0x3c) < 0xc) {
    *(uint *)((long)__s + 0x1d0) = *(uint *)((long)__s + 0x1d0) & 0xf8000000 | 0x1352c1d;
    *(uint *)((long)__s + 0x1d4) = *(uint *)((long)__s + 0x1d4) & 0xf8000000 | 0x7575680;
    *(uint *)((long)__s + 0x1d8) = *(uint *)((long)__s + 0x1d8) & 0xf8000000 | 0x2032beb;
    *(uint *)((long)__s + 0x1dc) = *(uint *)((long)__s + 0x1dc) & 0xffe00000 | 0x8080;
  }
  *(ulong *)((long)__s + 0x1e8) =
       *(ulong *)((long)__s + 0x1e8) & (ulong)DAT_002a0670 |
       CONCAT44(RVar19,RVar18) & (ulong)DAT_002a8f90;
  lVar30 = *(long *)((long)hal + 0x3b0);
  if ((((*(int *)(lVar30 + 0x1868) == 0) || ((*(byte *)(lVar30 + 0x186c) & 1) != 0)) ||
      (*(int *)(lVar30 + 400) != 0)) || (*(int *)(lVar30 + 0x194) != 0)) {
    if (*(int *)((long)hal + 0x374) == 2) {
      bVar14 = *(byte *)(lVar30 + 400);
    }
    else {
      bVar14 = *(byte *)(lVar30 + 0x194);
    }
  }
  else {
    bVar14 = *(byte *)((long)hal + 0x361);
    if ((bVar14 != 0) && ((bVar14 != 2 || (bVar14 = 3, *(int *)((long)hal + 0x374) == 2)))) {
      bVar14 = 2;
    }
  }
  *(uint *)((long)__s + 0x1f0) =
       (uint)(bVar14 & 3) << 8 |
       (uint)(byte)((bVar14 & 3) << 4) | *(uint *)((long)__s + 0x1f0) & 0xfffffccc |
       (uint)(bVar14 & 3);
  pEVar12 = task->rc_task;
  lVar30 = *(long *)((long)hal + 0x3b0);
  if (*(int *)(lVar30 + 0x94) == 2) {
    *(uint *)((long)__s + 0x1b4) =
         *(uint *)((long)__s + 0x1b4) & 0xffffc0ff | ((pEVar12->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x274) =
         *(uint *)((long)__s + 0x274) & 0xffc0ffff |
         ((pEVar12->info).quality_target & 0x3fU) << 0x10;
    uVar44 = ((pEVar12->info).quality_target & 0x3fU) << 0x14;
    uVar31 = *(uint *)((long)__s + 0x208);
    *(uint *)((long)__s + 0x208) = uVar31 & 0xfc0fffff | uVar44;
    *(uint *)((long)__s + 0x208) =
         uVar31 & 0xfffff | uVar44 | (pEVar12->info).quality_target << 0x1a;
    *(uint *)((long)__s + 0x204) = *(uint *)((long)__s + 0x204) & 0xfff | 0x1000;
  }
  else {
    pvVar10 = (task->syntax).data;
    uVar32 = *(ushort *)((long)pvVar10 + 4) + 0x1f >> 5;
    uVar44 = ((pEVar12->info).bit_target << 4) /
             (int)((*(ushort *)((long)pvVar10 + 6) + 0x1f >> 5) * uVar32);
    uVar31 = 0x50000;
    if (uVar44 < 0x100000) {
      uVar31 = uVar44;
    }
    uVar33 = (uVar31 * uVar32 >> 4) * 5 >> 4;
    uVar34 = *(uint *)((long)__s + 0x1b4) & 0xffffc0ff;
    *(uint *)((long)__s + 0x1b4) = ((pEVar12->info).quality_target & 0x3fU) << 8 | uVar34;
    uVar35 = *(uint *)((long)__s + 0x274) & 0xffc0ffff;
    *(uint *)((long)__s + 0x274) = ((pEVar12->info).quality_target & 0x3fU) << 0x10 | uVar35;
    *(uint *)((long)__s + 0x204) = uVar32 * 0x1000 + (*(uint *)((long)__s + 0x204) & 0xffc) + 3;
    uVar44 = *(uint *)((long)__s + 0x208);
    uVar36 = ((pEVar12->info).quality_max & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x208) = uVar44 & 0xfc0fffff | uVar36;
    uVar32 = (pEVar12->info).quality_min << 0x1a;
    *(uint *)((long)__s + 0x208) = uVar44 & 0xfffff | uVar36 | uVar32;
    *(uint *)((long)__s + 0x20c) = *(uint *)((long)__s + 0x20c) & 0xfff00000 | uVar31 & 0xfffff;
    if (*(int *)((long)hal + 0x414) == 0) {
      uVar32 = uVar44 & 0xffff | uVar36 | uVar32 |
               (*(uint *)(lVar30 + 0x17c + (ulong)(*(int *)((long)hal + 0x374) == 2) * 4) & 0xf) <<
               0x10;
    }
    else {
      uVar32 = uVar44 & 0xffff | uVar36 | uVar32;
    }
    *(uint *)((long)__s + 0x208) = uVar32;
    uVar27 = (ulong)(*(int *)((long)hal + 0x374) != 2);
    uVar31 = *(uint *)(lVar30 + 0x134 + uVar27 * 4);
    if ((((int)uVar31 < 0x34) && (uVar44 = *(uint *)(lVar30 + 300 + uVar27 * 4), uVar44 == uVar31))
       && (-1 < (int)uVar44)) {
      *(uint *)((long)__s + 0x1b4) = (uVar31 & 0x3f) << 8 | uVar34;
      *(uint *)((long)__s + 0x274) = (uVar31 & 0x3f) << 0x10 | uVar35;
      *(uint *)((long)__s + 0x208) = uVar32 & 0xfff0ffff;
    }
    *(uint *)((long)__s + 0x3f8) = uVar33 * -2;
    *(uint *)((long)__s + 0x3fc) = -uVar33;
    *(uint *)((long)__s + 0x400) = uVar33;
    *(uint *)((long)__s + 0x404) = uVar33 * 2;
    *(undefined8 *)((long)__s + 0x408) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)__s + 0x410) = 0x7fffffff7fffffff;
    *(undefined4 *)((long)__s + 0x418) = 0x7fffffff;
    *(uint *)((long)__s + 0x3f0) = *(uint *)((long)__s + 0x3f0) & 0xfe000000 | 0x2083fe;
    *(uint *)((long)__s + 0x3f4) = *(uint *)((long)__s + 0x3f4) & 0xfff00000;
  }
  uVar31 = (uint)*(byte *)(lVar30 + 0x3b0);
  if (*(byte *)(lVar30 + 0x3b0) == 0) {
    uVar31 = (pEVar12->info).quality_min;
  }
  uVar44 = *(uint *)((long)__s + 0x420);
  uVar31 = uVar31 & 0x3f;
  *(uint *)((long)__s + 0x420) = uVar44 & 0xffffffc0 | uVar31;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3a8);
  if (*(byte *)(lVar30 + 0x3a8) == 0) {
    uVar32 = (pEVar12->info).quality_max;
  }
  uVar33 = (uVar32 & 0x3f) << 6;
  *(uint *)((long)__s + 0x420) = uVar44 & 0xfffff000 | uVar31 | uVar33;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b1);
  if (*(byte *)(lVar30 + 0x3b1) == 0) {
    uVar32 = (pEVar12->info).quality_min;
  }
  uVar34 = (uVar32 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x420) = uVar44 & 0xfffc0000 | uVar31 | uVar33 | uVar34;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3a9);
  if (*(byte *)(lVar30 + 0x3a9) == 0) {
    uVar32 = (pEVar12->info).quality_max;
  }
  uVar35 = (uVar32 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x420) = uVar44 & 0xff000000 | uVar31 | uVar33 | uVar34 | uVar35;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b2);
  if (*(byte *)(lVar30 + 0x3b2) == 0) {
    uVar32 = (pEVar12->info).quality_min;
  }
  *(uint *)((long)__s + 0x420) =
       uVar44 & 0xc0000000 | uVar31 | uVar33 | uVar34 | uVar35 | (uVar32 & 0x3f) << 0x18;
  uVar31 = (uint)*(byte *)(lVar30 + 0x3aa);
  if (*(byte *)(lVar30 + 0x3aa) == 0) {
    uVar31 = (pEVar12->info).quality_max;
  }
  uVar44 = *(uint *)((long)__s + 0x424);
  uVar31 = uVar31 & 0x3f;
  *(uint *)((long)__s + 0x424) = uVar44 & 0xffffffc0 | uVar31;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b3);
  if (*(byte *)(lVar30 + 0x3b3) == 0) {
    uVar32 = (pEVar12->info).quality_min;
  }
  uVar33 = (uVar32 & 0x3f) << 6;
  *(uint *)((long)__s + 0x424) = uVar44 & 0xfffff000 | uVar31 | uVar33;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3ab);
  if (*(byte *)(lVar30 + 0x3ab) == 0) {
    uVar32 = (pEVar12->info).quality_max;
  }
  uVar34 = (uVar32 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x424) = uVar44 & 0xfffc0000 | uVar31 | uVar33 | uVar34;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b4);
  if (*(byte *)(lVar30 + 0x3b4) == 0) {
    uVar32 = (pEVar12->info).quality_min;
  }
  uVar35 = (uVar32 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x424) = uVar44 & 0xff000000 | uVar31 | uVar33 | uVar34 | uVar35;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3ac);
  if (*(byte *)(lVar30 + 0x3ac) == 0) {
    uVar32 = (pEVar12->info).quality_max;
  }
  *(uint *)((long)__s + 0x424) =
       uVar44 & 0xc0000000 | uVar31 | uVar33 | uVar34 | uVar35 | (uVar32 & 0x3f) << 0x18;
  uVar31 = (uint)*(byte *)(lVar30 + 0x3b5);
  if (*(byte *)(lVar30 + 0x3b5) == 0) {
    uVar31 = (pEVar12->info).quality_min;
  }
  uVar44 = *(uint *)((long)__s + 0x428);
  uVar31 = uVar31 & 0x3f;
  *(uint *)((long)__s + 0x428) = uVar44 & 0xffffffc0 | uVar31;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3ad);
  if (*(byte *)(lVar30 + 0x3ad) == 0) {
    uVar32 = (pEVar12->info).quality_max;
  }
  uVar33 = (uVar32 & 0x3f) << 6;
  *(uint *)((long)__s + 0x428) = uVar44 & 0xfffff000 | uVar31 | uVar33;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b6);
  if (*(byte *)(lVar30 + 0x3b6) == 0) {
    uVar32 = (pEVar12->info).quality_min;
  }
  uVar34 = (uVar32 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x428) = uVar44 & 0xfffc0000 | uVar31 | uVar33 | uVar34;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3ae);
  if (*(byte *)(lVar30 + 0x3ae) == 0) {
    uVar32 = (pEVar12->info).quality_max;
  }
  uVar35 = (uVar32 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x428) = uVar44 & 0xff000000 | uVar31 | uVar33 | uVar34 | uVar35;
  uVar32 = (uint)*(byte *)(lVar30 + 0x3b7);
  if (*(byte *)(lVar30 + 0x3b7) == 0) {
    uVar32 = (pEVar12->info).quality_min;
  }
  *(uint *)((long)__s + 0x428) =
       uVar44 & 0xc0000000 | uVar31 | uVar33 | uVar34 | uVar35 | (uVar32 & 0x3f) << 0x18;
  uVar31 = (uint)*(byte *)(lVar30 + 0x3af);
  if (*(byte *)(lVar30 + 0x3af) == 0) {
    uVar31 = (pEVar12->info).quality_max;
  }
  *(uint *)((long)__s + 0x42c) = *(uint *)((long)__s + 0x42c) & 0xffffffc0 | uVar31 & 0x3f;
  *(byte *)((long)__s + 0x475) = *(byte *)((long)__s + 0x475) & 0xf0;
  *(undefined8 *)((long)__s + 0x520) = 0xcd08d52a142df7a9;
  *(undefined8 *)((long)__s + 0x528) = 0x1a6e0cc306db2bc5;
  *(undefined8 *)((long)__s + 0x530) = 0x85300097fa51cc1b;
  *(undefined8 *)((long)__s + 0x538) = 0xe33b99add8ab4872;
  *(undefined8 *)((long)__s + 0x540) = 0xc750001393df77fe;
  *(undefined8 *)((long)__s + 0x548) = 0x44456770c1ee3d37;
  *(undefined4 *)((long)__s + 0x550) = 0xfcba9631;
  lVar30 = *(long *)((long)hal + 0x3b0);
  iVar17 = *(int *)((long)hal + 0x374);
  uVar31 = 0x55;
  if (*(int *)(lVar30 + 0x18c) == 0) {
    uVar44 = 0x90;
    uVar32 = 0xab;
    if (iVar17 == 2) {
      uVar32 = uVar44;
    }
    uVar33 = 0xdc;
    if (iVar17 == 2) {
      uVar33 = 0xab;
    }
    if (*(int *)((long)hal + 0x414) == 0) {
      uVar44 = 0xab;
      uVar32 = uVar33;
    }
    *(undefined8 *)(lVar30 + 0x2e8) = 0x600000003;
    *(undefined4 *)(lVar30 + 0x2cc) = 3;
    *(undefined8 *)(lVar30 + 0x2d0) = 0xd00000006;
    *(undefined4 *)(lVar30 + 0x2f0) = 0xd;
    *(uint *)(lVar30 + 0x2f4) = uVar44;
    *(uint *)(lVar30 + 0x2d8) = uVar44;
    *(uint *)(lVar30 + 0x2f8) = uVar44;
    *(uint *)(lVar30 + 0x2dc) = uVar44;
    *(uint *)(lVar30 + 0x2fc) = uVar32;
    *(uint *)(lVar30 + 0x2e0) = uVar32;
    *(uint *)(lVar30 + 0x300) = uVar44;
    *(uint *)(lVar30 + 0x2e4) = uVar44;
    *(undefined8 *)(lVar30 + 0x304) = 0x5500000055;
    *(undefined8 *)(lVar30 + 0x30c) = 0x5500000055;
    uVar33 = 3;
    bVar14 = 0xd;
    uVar34 = uVar44;
    uVar35 = uVar44;
  }
  else {
    if (iVar17 != 2) {
      uVar33 = (uint)*(byte *)(lVar30 + 0x2e8);
      uVar15 = *(uint *)(lVar30 + 0x2ec);
      bVar14 = (byte)*(undefined4 *)(lVar30 + 0x2f0);
      uVar44 = (uint)*(ushort *)(lVar30 + 0x2f4);
      uVar34 = (uint)*(ushort *)(lVar30 + 0x2f8);
      uVar32 = (uint)*(ushort *)(lVar30 + 0x2fc);
      uVar35 = (uint)*(ushort *)(lVar30 + 0x300);
      uVar31 = *(uint *)(lVar30 + 0x304) & 0x3ff;
      uVar41 = (*(uint *)(lVar30 + 0x308) & 0x3ff) << 10;
      uVar39 = (*(uint *)(lVar30 + 0x30c) & 0x3ff) << 0x14;
      uVar36 = *(uint *)(lVar30 + 0x310) & 0x3ff;
      goto LAB_00251bcb;
    }
    uVar33 = (uint)*(byte *)(lVar30 + 0x2cc);
    uVar15 = *(uint *)(lVar30 + 0x2d0);
    bVar14 = (byte)*(undefined4 *)(lVar30 + 0x2d4);
    uVar44 = (uint)*(ushort *)(lVar30 + 0x2d8);
    uVar32 = (uint)*(ushort *)(lVar30 + 0x2e0);
    uVar34 = (uint)*(ushort *)(lVar30 + 0x2dc);
    uVar35 = (uint)*(ushort *)(lVar30 + 0x2e4);
  }
  uVar41 = 0x15400;
  uVar39 = 0x5500000;
  uVar36 = uVar31;
LAB_00251bcb:
  uVar49 = 0;
  *(ulong *)((long)__s + 0x584) =
       CONCAT44((uVar34 & 0x3ff) << 10 | uVar44 & 0x3ff | (uVar32 & 0x3ff) << 0x14,
                (uint)bVar14 << 0x10 | (uVar15 & 0xff) << 8 | uVar33) |
       *(ulong *)((long)__s + 0x584) & 0xc0000000ff000000;
  *(ulong *)((long)__s + 0x58c) =
       CONCAT44(uVar31 | uVar41 | uVar39,uVar35) & 0xffffffff000003ff |
       *(ulong *)((long)__s + 0x58c) & 0xc0000000fffffc00;
  *(uint *)((long)__s + 0x594) = *(uint *)((long)__s + 0x594) & 0xfffffc00 | uVar36;
  *(undefined2 *)((long)__s + 0x93a) = 0x404;
  *(undefined4 *)((long)__s + 0x93c) = 0x4040404;
  uVar31 = *(uint *)(lVar8 + 0x24) >> 2 & 1;
  uVar15 = *(uint *)((long)__s + 0x268);
  *(uint *)((long)__s + 0x268) = uVar15 & 0xfffffffe | uVar31;
  uVar44 = (uint)(byte)(*(char *)(lVar8 + 0x1d) * '\x02');
  *(uint *)((long)__s + 0x268) = uVar15 & 0xffffff00 | uVar31 | uVar44;
  uVar32 = (*(byte *)(lVar8 + 0x1e) & 0x3f) << 9;
  *(uint *)((long)__s + 0x268) = uVar15 & 0xffff8100 | uVar31 | uVar44 | uVar32;
  uVar33 = *(uint *)(lVar8 + 0x24) >> 9 & 0x100;
  *(uint *)((long)__s + 0x268) = uVar15 & 0xffff8000 | uVar31 | uVar44 | uVar32 | uVar33;
  uVar34 = *(uint *)(lVar8 + 0x24) >> 3 & 0x8000;
  *(uint *)((long)__s + 0x268) = uVar15 & 0xffff0000 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34;
  uVar35 = (*(uint *)(lVar8 + 0x14) & 0x1e00) << 7;
  *(uint *)((long)__s + 0x268) =
       uVar15 & 0xfff00000 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34 | uVar35;
  *(uint *)((long)__s + 0x268) =
       (uVar15 & 0xffe00000 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34 | uVar35) +
       (*(uint *)(lVar8 + 0x24) & 0x80000) * 2;
  uVar31 = *(uint *)(lVar8 + 0x24) >> 0x14 & 1;
  uVar15 = *(uint *)((long)__s + 0x26c);
  *(uint *)((long)__s + 0x26c) = uVar15 & 0xfffffffe | uVar31;
  uVar44 = *(uint *)(lVar8 + 0x24) >> 0x14 & 2;
  *(uint *)((long)__s + 0x26c) = uVar15 & 0xfffffffc | uVar31 | uVar44;
  uVar32 = *(uint *)(lVar8 + 0x24) >> 0x14 & 0x1c;
  *(uint *)((long)__s + 0x26c) = uVar15 & 0xffffffe0 | uVar31 | uVar44 | uVar32;
  uVar33 = *(uint *)(lVar8 + 0x24) >> 0x14 & 0x20;
  *(uint *)((long)__s + 0x26c) = uVar15 & 0xffffffc0 | uVar31 | uVar44 | uVar32 | uVar33;
  uVar34 = *(uint *)(lVar8 + 0x24) >> 0x14 & 0x40;
  *(uint *)((long)__s + 0x26c) = uVar15 & 0xffffff80 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34;
  uVar35 = (uint)(*(char *)(lVar8 + 0x21) + 0x1aU & 0x3f) << 7;
  *(uint *)((long)__s + 0x26c) =
       uVar15 & 0xffffe000 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34 | uVar35;
  uVar36 = (*(uint *)(lVar8 + 0x28) & 4) << 0xb;
  *(uint *)((long)__s + 0x26c) =
       uVar15 & 0xffffc000 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34 | uVar35 | uVar36;
  uVar41 = (*(uint *)(lVar8 + 0x28) & 8) << 0xb;
  *(uint *)((long)__s + 0x26c) =
       uVar15 & 0xffff8000 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34 | uVar35 | uVar36 | uVar41;
  uVar42 = (*(uint *)(lVar8 + 0x28) & 0x800) << 4;
  *(uint *)((long)__s + 0x26c) =
       uVar15 & 0xffff0000 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34 | uVar35 | uVar36 | uVar41 |
       uVar42;
  uVar39 = (*(uint *)(lVar8 + 0x28) & 0x1000) << 4;
  *(uint *)((long)__s + 0x26c) =
       uVar15 & 0xfffe0000 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34 | uVar35 | uVar36 | uVar41 |
       uVar42 | uVar39;
  uVar15 = (uVar15 & 0xfffc0000 | uVar31 | uVar44 | uVar32 | uVar33 | uVar34 | uVar35 | uVar36 |
            uVar41 | uVar42 | uVar39) + (*(uint *)(lVar8 + 0x28) & 0x4000) * 8;
  *(uint *)((long)__s + 0x26c) = uVar15;
  uVar15 = (uVar15 & 0xfffbffff) + (*(uint *)(lVar8 + 0x28) & 0x8000) * 8;
  *(uint *)((long)__s + 0x26c) = uVar15;
  uVar31 = (*(byte *)(lVar8 + 0xd0) & 3) << 0x13;
  *(uint *)((long)__s + 0x26c) = uVar15 & 0xffe7ffff | uVar31;
  *(uint *)((long)__s + 0x26c) =
       uVar15 & 0xffc7ffff | uVar31 | (*(uint *)(lVar8 + 0x28) & 0x400) << 0xb;
  uVar31 = *(uint *)(lVar8 + 0xe4) >> 4 & 1;
  uVar15 = *(uint *)((long)__s + 0x270);
  *(uint *)((long)__s + 0x270) = uVar15 & 0xfffffffe | uVar31;
  uVar44 = *(uint *)(lVar8 + 0xe4) >> 4 & 2;
  *(uint *)((long)__s + 0x270) = uVar15 & 0xfffffffc | uVar31 | uVar44;
  uVar32 = *(uint *)(lVar8 + 0xe4) >> 3 & 0x20;
  *(uint *)((long)__s + 0x270) = uVar15 & 0xffffffdc | uVar31 | uVar44 | uVar32;
  uVar33 = (uint)(byte)(*(char *)(lVar8 + 0xf0) << 6);
  *(uint *)((long)__s + 0x270) = uVar15 & 0xffffff1c | uVar31 | uVar44 | uVar32 | uVar33;
  uVar34 = (*(byte *)(lVar8 + 0xf1) & 3) << 8;
  *(uint *)((long)__s + 0x270) = uVar15 & 0xfffffc1c | uVar31 | uVar44 | uVar32 | uVar33 | uVar34;
  uVar15 = (uVar15 & 0xfffff81c | uVar31 | uVar44 | uVar32 | uVar33 | uVar34) +
           (*(uint *)(lVar8 + 0xe4) & 0x200) * 2;
  *(uint *)((long)__s + 0x270) = uVar15;
  uVar15 = (uVar15 & 0xfffff7ff) + (*(uint *)(lVar8 + 0xe4) & 0x400) * 2;
  *(uint *)((long)__s + 0x270) = uVar15;
  uVar15 = (uVar15 & 0xffffefff) + (*(uint *)(lVar8 + 0xe4) & 0x800) * 2;
  *(uint *)((long)__s + 0x270) = uVar15;
  uVar15 = (uVar15 & 0xffffdfff) + (*(uint *)(lVar8 + 0xe4) & 0x1000) * 2;
  *(uint *)((long)__s + 0x270) = uVar15;
  *(uint *)((long)__s + 0x1b4) =
       *(uint *)((long)__s + 0x1b4) & 0xfff83fff | (*(uint *)(lVar8 + 0x11c) & 0x1f) << 0xe;
  uVar15 = (uVar15 & 0xffffbfff) + (*(uint *)(lVar8 + 0xe4) & 0x2000) * 2;
  *(uint *)((long)__s + 0x270) = uVar15;
  uVar33 = (*(byte *)(lVar8 + 0xf2) & 3) << 0xf;
  *(uint *)((long)__s + 0x270) = uVar15 & 0xfffe7fff | uVar33;
  uVar34 = (*(byte *)(lVar8 + 0xf3) & 0x7f) << 0x11;
  *(uint *)((long)__s + 0x270) = uVar15 & 0xff007fff | uVar33 | uVar34;
  uVar35 = (*(uint *)(lVar8 + 0xe4) & 0x4000) << 10;
  *(uint *)((long)__s + 0x270) = uVar15 & 0xfe007fff | uVar33 | uVar34 | uVar35;
  uVar36 = (*(byte *)(lVar8 + 0xf4) & 0x3f) << 0x19;
  *(uint *)((long)__s + 0x270) = uVar15 & 0x80007fff | uVar33 | uVar34 | uVar35 | uVar36;
  uVar39 = (*(uint *)(lVar8 + 0xe4) & 0x8000) << 0x10;
  *(uint *)((long)__s + 0x270) = uVar15 & 0x7fff | uVar33 | uVar34 | uVar35 | uVar36 | uVar39;
  uVar31 = *(uint *)((long)__s + 0x274);
  uVar41 = *(byte *)(lVar8 + 0xea) & 0xf;
  *(uint *)((long)__s + 0x274) = uVar31 & 0xfffffff0 | uVar41;
  uVar42 = (uint)(byte)(*(char *)(lVar8 + 0xeb) << 4);
  *(uint *)((long)__s + 0x274) = uVar31 & 0xffffff00 | uVar41 | uVar42;
  uVar43 = *(uint *)(lVar8 + 0xe4) >> 8 & 0x100;
  *(uint *)((long)__s + 0x274) = uVar31 & 0xfffffe00 | uVar41 | uVar42 | uVar43;
  uVar44 = *(uint *)(lVar8 + 0xe4) >> 8 & 0x200;
  *(uint *)((long)__s + 0x274) = uVar31 & 0xfffffc00 | uVar41 | uVar42 | uVar43 | uVar44;
  uVar32 = *(uint *)(lVar8 + 0xe4) >> 8 & 0x400;
  *(uint *)((long)__s + 0x274) = uVar31 & 0xfffff800 | uVar41 | uVar42 | uVar43 | uVar44 | uVar32;
  pbVar26 = (byte *)(lVar8 + 0xec);
  if ((*(byte *)(lVar8 + 0x28) & 8) == 0) {
    pbVar26 = (byte *)(lVar8 + 0x2c);
  }
  uVar44 = (*pbVar26 & 0x1f) * 0x800 +
           (uVar31 & 0xff3f0000 | uVar41 | uVar42 | uVar43 | uVar44 | uVar32) + 0x400000;
  *(uint *)((long)__s + 0x274) = uVar44;
  uVar43 = (*(uint *)(lVar8 + 0xe4) & 0x80000) << 6;
  *(uint *)((long)__s + 0x274) = uVar44 & 0xfd7fffff | uVar43;
  uVar40 = (*(uint *)(lVar8 + 0xe4) & 0x100000) << 6;
  *(uint *)((long)__s + 0x274) = uVar44 & 0xf97fffff | uVar43 | uVar40;
  uVar31 = CONCAT22(*(undefined2 *)((long)__s + 0x27a),*(undefined2 *)(lVar8 + 0xfc));
  *(uint *)((long)__s + 0x278) = uVar31;
  *(uint *)((long)__s + 0x278) = uVar31 & 0xfe00ffff | (*(ushort *)(lVar8 + 0xfe) & 0x1ff) << 0x10;
  uVar32 = *(uint *)(lVar8 + 0xe4) >> 0x15 & 1;
  uVar31 = *(uint *)((long)__s + 0x27c);
  *(uint *)((long)__s + 0x27c) = uVar31 & 0xfffffffe | uVar32;
  uVar31 = (uVar31 & 0xfffe0000 | uVar32) + (uint)*(ushort *)(lVar8 + 0x100) * 2;
  *(uint *)((long)__s + 0x27c) = uVar31;
  *(uint *)((long)__s + 0x27c) = uVar31 & 0xff3fffff | (*(byte *)(lVar8 + 0xf6) & 3) << 0x16;
  uVar31 = (*(uint *)((long)__s + 0x280) & 0xfbffffff) + (*(uint *)(lVar8 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x280) = uVar31;
  uVar32 = (uint)*(ushort *)(lVar8 + 0x106) << 10;
  *(uint *)((long)__s + 0x280) = uVar31 & 0xfc0003ff | uVar32;
  uVar31 = (uVar31 & 0xdc0003ff | uVar32) + (*(uint *)(lVar8 + 0xe4) & 0x4000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar31;
  uVar31 = (uVar31 & 0xbfffffff) + (*(uint *)(lVar8 + 0xe4) & 0x8000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar31;
  uVar31 = (uVar31 & 0x7fffffff) + (*(uint *)(lVar8 + 0xe4) & 0xf0000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar31;
  uVar31 = (uVar31 & 0xfbffffff) + (*(uint *)(lVar8 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x280) = uVar31;
  uVar32 = (uint)*(ushort *)(lVar8 + 0x106) << 10;
  *(uint *)((long)__s + 0x280) = uVar31 & 0xfc0003ff | uVar32;
  uVar31 = (uVar31 & 0xf40003ff | uVar32) + (*(uint *)(lVar8 + 0xe4) & 0x1000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar31;
  uVar32 = (*(byte *)(lVar8 + 0xfa) & 0x1f) << 5;
  *(uint *)((long)__s + 0x280) = uVar31 & 0xfffffc1f | uVar32;
  uVar41 = *(uint *)(lVar8 + 0xe4) >> 0x12 & 0x10;
  *(uint *)((long)__s + 0x280) = uVar31 & 0xfffffc0f | uVar32 | uVar41;
  uVar42 = *(byte *)(lVar8 + 0xf9) & 0xf;
  *(uint *)((long)__s + 0x280) = uVar31 & 0xfffffc00 | uVar32 | uVar41 | uVar42;
  uVar6 = *(undefined2 *)(lVar8 + 0x108);
  *(undefined2 *)((long)__s + 0x284) = uVar6;
  *(uint *)((long)__s + 0x284) = CONCAT22(*(undefined2 *)(lVar8 + 0x10a),uVar6);
  uVar6 = *(undefined2 *)(lVar8 + 0x10c);
  *(undefined2 *)((long)__s + 0x288) = uVar6;
  *(uint *)((long)__s + 0x288) = CONCAT22(*(undefined2 *)(lVar8 + 0x10e),uVar6);
  uVar6 = *(undefined2 *)(lVar8 + 0x110);
  *(undefined2 *)((long)__s + 0x28c) = uVar6;
  uVar7 = *(undefined2 *)(lVar8 + 0x114);
  *(undefined2 *)((long)__s + 0x290) = uVar7;
  *(uint *)((long)__s + 0x28c) = CONCAT22(*(undefined2 *)(lVar8 + 0x112),uVar6);
  *(uint *)((long)__s + 0x280) =
       (uVar31 & 0xeffffc00 | uVar32 | uVar41 | uVar42) + (*(uint *)(lVar8 + 0xe4) & 0x2000000) * 8;
  *(uint *)((long)__s + 0x290) = CONCAT22(*(undefined2 *)(lVar8 + 0x116),uVar7);
  *(uint *)((long)__s + 0x274) =
       uVar44 & 0x817fffff | uVar43 | uVar40 | (*(byte *)(lVar8 + 0xef) & 0xf) << 0x1b;
  *(uint *)((long)__s + 0x270) =
       uVar15 & 0x7fdf | uVar33 | uVar34 | uVar35 | uVar36 | uVar39 |
       *(uint *)(lVar8 + 0xe4) >> 3 & 0x20;
  uVar45 = *(ushort *)(lVar8 + 10);
  if (uVar45 == 0) {
    uVar45 = *(ushort *)(lVar8 + 6);
  }
  uVar5 = *(ushort *)(lVar8 + 8);
  uVar15 = *puVar28;
  pMVar11 = *(MppDevRegOffCfgs **)((long)hal + 0x3b8);
  MVar20 = mpp_frame_get_fmt(task->frame);
  if ((MVar20 & 0xf00000) == MPP_FMT_YUV420SP) {
    RVar19 = (uint)uVar45 * (uint)uVar5;
    switch(uVar15) {
    case 0:
    case 1:
    case 2:
    case 8:
    case 9:
    case 10:
      RVar18 = 0;
      RVar19 = 0;
      break;
    default:
      _mpp_log_l(2,"hal_h265e_v511","unknown color space: %d\n","vepu511_h265_set_patch_info",
                 (ulong)uVar15);
    case 7:
      RVar18 = RVar19 * 5 >> 2;
      break;
    case 4:
    case 6:
    case 0xc:
      RVar18 = RVar19;
      break;
    case 5:
      RVar18 = RVar19 * 3 >> 1;
      break;
    case 0xd:
      RVar18 = RVar19 * 2;
    }
  }
  else {
    RVar19 = mpp_frame_get_fbc_offset(task->frame);
    RVar18 = RVar19;
  }
  mpp_dev_multi_offset_update(pMVar11,0xa1,RVar19);
  mpp_dev_multi_offset_update(pMVar11,0xa2,RVar18);
  if (*(MppBuffer *)((long)hal + 0x428) == (MppBuffer)0x0) {
    *(undefined8 *)((long)__s + 0x17c) = 0;
  }
  else {
    iVar17 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x428),"setup_vepu511_ext_line_buf");
    *(int *)((long)__s + 0x180) = iVar17;
    *(int *)((long)__s + 0x17c) = iVar17;
    mpp_dev_multi_offset_update
              (*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xb2,*(RK_U32 *)((long)hal + 0x420));
  }
  uVar27 = (ulong)*(uint *)(*(long *)((long)hal + 0x3b0) + 0x189c);
  uVar15 = *(uint *)((long)__s + 0x254);
  *(uint *)((long)__s + 0x254) = uVar15 & 0xefffffff | (uint)(uVar27 != 0) << 0x1c;
  uVar31 = *(ushort *)((long)&vepu511_h265_set_atf_regs_b16_skip_thd2 + uVar27 * 2) & 0xfff;
  *(uint *)((long)__s + 0x888) =
       (*(ushort *)((long)&vepu511_h265_set_atf_regs_b32_skip_thd3 + uVar27 * 2) & 0xfff) << 0x10 |
       *(uint *)((long)__s + 0x888) & 0xf000f000 | uVar31;
  iVar17 = (uint)*(byte *)((long)&vepu511_h265_set_atf_regs_b16_skip_wgt3 + uVar27) * 0x1000000 +
           (uint)*(byte *)((long)&vepu511_h265_set_atf_regs_b16_skip_wgt0 + uVar27) + 0x101000;
  *(int *)((long)__s + 0x88c) = iVar17;
  *(uint *)((long)__s + 0x884) = *(uint *)((long)__s + 0x884) & 0x9000f000 | 0x600a0005;
  uVar44 = *(ushort *)((long)&vepu511_h265_set_atf_regs_b16_intra_thd0 + uVar27 * 2) & 0xfff;
  uVar32 = (*(ushort *)((long)&vepu511_h265_set_atf_regs_b16_intra_thd1 + uVar27 * 2) & 0xfff) <<
           0x10;
  *(uint *)((long)__s + 0x8bc) = *(uint *)((long)__s + 0x8bc) & 0xf000f000 | uVar44 | uVar32;
  uVar33 = *(ushort *)((long)&vepu511_h265_set_atf_regs_b16_intra_thd2 + uVar27 * 2) & 0xfff;
  *(uint *)((long)__s + 0x8c0) = *(uint *)((long)__s + 0x8c0) & 0xfffff000 | uVar33;
  bVar14 = *(byte *)((long)&vepu511_h265_set_atf_regs_b16_intra_wgt0 + uVar27);
  bVar1 = *(byte *)((long)&vepu511_h265_set_atf_regs_b16_intra_wgt1 + uVar27);
  bVar2 = *(byte *)((long)&vepu511_h265_set_atf_regs_b16_intra_wgt2 + uVar27);
  *(uint *)((long)__s + 0x8c4) =
       (uint)*(byte *)((long)__s + 0x8c7) << 0x18 | (uint)bVar14 | (uint)bVar1 << 8 |
       (uint)bVar2 << 0x10;
  *(uint *)((long)__s + 0x894) = *(uint *)((long)__s + 0x894) & 0xf000f000 | 0xa0001;
  *(uint *)((long)__s + 0x898) =
       (*(ushort *)((long)&vepu511_h265_set_atf_regs_b16_skip_thd3 + uVar27 * 2) & 0xfff) << 0x10 |
       *(uint *)((long)__s + 0x898) & 0xf000f000 | uVar31;
  *(int *)((long)__s + 0x89c) = iVar17;
  *(uint *)((long)__s + 0x8a4) = *(uint *)((long)__s + 0x8a4) & 0xf000f000 | 0x280014;
  *(uint *)((long)__s + 0x8a8) = *(uint *)((long)__s + 0x8a8) & 0xfffff000 | 0x48;
  *(uint *)((long)__s + 0x8ac) = *(uint *)((long)__s + 0x8ac) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x8b0) = *(uint *)((long)__s + 0x8b0) & 0xf000f000 | 0x280014;
  *(uint *)((long)__s + 0x8b4) = *(uint *)((long)__s + 0x8b4) & 0xfffff000 | 0x48;
  *(undefined4 *)((long)__s + 0x8b8) = 0x10101010;
  *(uint *)((long)__s + 0x8c8) = *(uint *)((long)__s + 0x8c8) & 0xf000f000 | uVar44 | uVar32;
  *(uint *)((long)__s + 0x8cc) = *(uint *)((long)__s + 0x8cc) & 0xfffff000 | uVar33;
  *(uint *)((long)__s + 0x8d0) = CONCAT12(bVar2,CONCAT11(bVar1,bVar14)) + 0x10000000;
  iVar17 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x1884);
  *(undefined8 *)((long)__s + 0x954) = 0x90d060c12131214;
  uVar16 = 0xc5111112;
  if (iVar17 == 0) {
    uVar16 = 0x45111112;
  }
  *(undefined4 *)((long)__s + 0x95c) = 0x90d060c;
  *(uint *)((long)__s + 0x970) = *(uint *)((long)__s + 0x970) & 0xfff88080 | 0x50507;
  *(undefined8 *)((long)__s + 0x974) = 0x90d060c12131214;
  *(undefined4 *)((long)__s + 0x97c) = 0x90d060c;
  *(uint *)((long)__s + 0x944) = *(uint *)((long)__s + 0x944) & 0x80808080 | 0x3050f05;
  *(uint *)((long)__s + 0x948) = *(uint *)((long)__s + 0x948) & 0x80808080 | 0x5070603;
  *(uint *)((long)__s + 0x94c) = *(uint *)((long)__s + 0x94c) & 0x80808080 | 0x507050a;
  *(uint *)((long)__s + 0x950) = *(uint *)((long)__s + 0x950) & 0xfc088080 | 0x1c50507;
  auVar46._0_8_ = *(ulong *)((long)__s + 0x960) & 0x8080808008000000;
  auVar46._8_4_ = *(uint *)((long)__s + 0x968) & 0x80808080;
  auVar46._12_4_ = *(uint *)((long)__s + 0x96c) & 0x80808080;
  auVar13._4_8_ = uVar49;
  auVar13._0_4_ = 0x3050f05;
  auVar47._0_8_ = auVar13._0_8_ << 0x20;
  auVar47._8_4_ = 0x5070603;
  auVar47._12_4_ = 0x507050a;
  auVar48._4_12_ = auVar47._4_12_;
  auVar48._0_4_ = uVar16;
  *(undefined1 (*) [16])((long)__s + 0x960) = auVar48 | auVar46;
  *(uint *)((long)__s + 0x980) = *(uint *)((long)__s + 0x980) & 0x88000000 | 0x34111112;
  *(ulong *)((long)__s + 0x824) =
       *(ulong *)((long)__s + 0x824) & 0xff000000fffff800 | (ulong)DAT_002ad6f0;
  *(uint *)((long)__s + 0x85c) = *(uint *)((long)__s + 0x85c) & 0xf0c0f002 | 0xf270fa0;
  *(uint *)((long)__s + 0x860) = *(uint *)((long)__s + 0x860) & 0x6000e000 | 0x7d01770;
  *(uint *)((long)__s + 0x864) = *(uint *)((long)__s + 0x864) & 0xf800e000 | 0x500012c;
  *(uint *)((long)__s + 0x868) = *(uint *)((long)__s + 0x868) & 0xf800f800 | 0x2000000;
  *(ulong *)((long)__s + 0x86c) =
       *(ulong *)((long)__s + 0x86c) & 0xff000080c0000000 | (ulong)DAT_002ad720;
  *(uint *)((long)__s + 0x874) = *(uint *)((long)__s + 0x874) & 0xc0000000 | 0x208a3d1e;
  lVar30 = *(long *)((long)hal + 0x3b0);
  lVar29 = (long)*(int *)(lVar30 + 0x186c);
  uVar31 = *(int *)((long)hal + 0x350) * 1000;
  if (uVar31 < (uint)*(byte *)((long)&vepu511_h265_set_smear_regs_flag_cover_thd0 + lVar29) *
               *(int *)((long)hal + 0x334)) {
    lVar37 = 0;
  }
  else {
    lVar37 = 2 - (ulong)(uVar31 < *(int *)((long)hal + 0x334) *
                                  (uint)*(byte *)((long)&vepu511_h265_set_smear_regs_flag_cover_thd1
                                                 + lVar29));
  }
  iVar17 = 1;
  if (1 < *(int *)(lVar30 + 0xc4)) {
    iVar17 = *(int *)(lVar30 + 0xc4);
  }
  uVar44 = *(int *)((long)hal + 0x3fc) % iVar17;
  uVar31 = 8;
  if (uVar44 < 2) {
    uVar31 = 2;
  }
  *(uint *)((long)__s + 0x834) =
       (*(uint *)((long)__s + 0x834) & 0xff000080 | *(uint *)(lVar30 + 0x1868) & 1 | uVar31) +
       (uint)(uVar44 != iVar17 - 1U && uVar44 != 0) * 4 | 0xb8a812;
  *(uint *)((long)__s + 0x838) = *(uint *)((long)__s + 0x838) & 0x80000000 | 0x207a8000;
  *(uint *)((long)__s + 0x83c) = *(uint *)((long)__s + 0x83c) & 0xc0000000 | 0x1449088a;
  *(uint *)((long)__s + 0x840) = *(uint *)((long)__s + 0x840) & 0xf000f000 | 0xeef0eef;
  *(uint *)((long)__s + 0x844) = *(uint *)((long)__s + 0x844) & 0xc0c0e0e0 | 0x22301015;
  *(ulong *)((long)__s + 0x848) =
       *(ulong *)((long)__s + 0x848) & 0x8000ffc0c0c0 | (ulong)DAT_002acdb0;
  uVar31 = *(byte *)((long)&vepu511_h265_set_smear_regs_thre_madp_stc_cover1 + lVar29) & 0x3f;
  uVar44 = *(byte *)((long)&vepu511_h265_set_smear_regs_thre_madp_mov_cover1 + lVar29) & 0x1f;
  *(uint *)((long)__s + 0x850) =
       ((uint)(byte)(&vepu511_h265_set_smear_regs_flag_cover_wgt)[lVar37] +
        (uint)*(byte *)((long)&vepu511_h265_set_smear_regs_qp_strength + lVar29) & 0xf) * 0x400000 +
       (uVar31 << 6 | uVar31 | uVar44 << 0xc | uVar44 << 0x11) + 0x78000000;
  *(undefined4 *)((long)__s + 0x878) = 0x4038f8df;
  *(undefined8 *)((long)__s + 0x82c) = 0x775145147720828c;
  *(uint *)((long)__s + 0x87c) = *(uint *)((long)__s + 0x87c) & 0xffe00000 | 0x851ab;
  uVar15 = uVar15 >> 0x18 & 3;
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","enter\n","vepu511_h265_set_scaling_list");
  }
  if (uVar15 == 2) {
    _mpp_log_l(4,"hal_h265e_v511","scaling_list_mode 2 is not supported yet\n",
               "vepu511_h265_set_scaling_list");
  }
  else if (uVar15 == 1) {
    lVar30 = 0;
    for (uVar27 = 0x3f; uVar27 != 0xffffffffffffffff; uVar27 = uVar27 - 1) {
      RVar3 = "\x10\x10\x10\x10\x11\x12\x15\x18\x10\x10\x10\x10\x11\x13\x16\x19\x10\x10\x11\x12\x14\x16\x19\x1d\x10\x10\x12\x15\x18\x1b\x1f$\x11\x11\x14\x18\x1e#)/\x12\x13\x16\x1b#,6A\x15\x16\x19\x1f)6FX\x18\x19\x1d$/AXs"
              [uVar27 & 0xffffffff];
      *(RK_U8 *)((long)__s + lVar30 + 0x988) = RVar3;
      uVar15 = (uint)lVar30;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x40) + 0x988) = RVar3;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x80) + 0x988) = RVar3;
      RVar4 = "\x10\x10\x10\x10\x11\x12\x14\x18\x10\x10\x10\x11\x12\x14\x18\x19\x10\x10\x11\x12\x14\x18\x19\x1c\x10\x11\x12\x14\x18\x19\x1c!\x11\x12\x14\x18\x19\x1c!)\x12\x14\x18\x19\x1c!)6\x14\x18\x19\x1c!)6G\x18\x19\x1c!)6G["
              [uVar27 & 0xffffffff];
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0xc0) + 0x988) = RVar4;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x100) + 0x988) = RVar4;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x140) + 0x988) = RVar4;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x180) + 0x988) = RVar3;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x1c0) + 0x988) = RVar3;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x200) + 0x988) = RVar3;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x240) + 0x988) = RVar4;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x280) + 0x988) = RVar4;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x2c0) + 0x988) = RVar4;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x300) + 0x988) = RVar3;
      *(RK_U8 *)((long)__s + (ulong)(uVar15 | 0x340) + 0x988) = RVar4;
      lVar30 = lVar30 + 1;
    }
    *(undefined8 *)((long)__s + 0xd08) = 0x1010101010101010;
  }
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","leave\n","vepu511_h265_set_scaling_list");
  }
  lVar30 = *(long *)((long)hal + 0x3b0);
  iVar17 = *(int *)((long)hal + 0x374);
  lVar29 = (ulong)(iVar17 != 2) * 0x40 + lVar30;
  uVar32 = *(uint *)(lVar29 + 0x218) & 0x1f;
  uVar15 = *(uint *)((long)__s + 0x444);
  uVar31 = *(uint *)((long)__s + 0x448);
  *(uint *)((long)__s + 0x444) = uVar15 & 0xffffffe0 | uVar32;
  uVar33 = (*(uint *)(lVar29 + 0x21c) & 0x1f) << 5;
  *(uint *)((long)__s + 0x444) = uVar15 & 0xfffffc00 | uVar32 | uVar33;
  uVar34 = (*(uint *)(lVar29 + 0x220) & 0x1f) << 10;
  *(uint *)((long)__s + 0x444) = uVar15 & 0xffff8000 | uVar32 | uVar33 | uVar34;
  uVar35 = (*(uint *)(lVar29 + 0x224) & 0x1f) << 0xf;
  *(uint *)((long)__s + 0x444) = uVar15 & 0xfff00000 | uVar32 | uVar33 | uVar34 | uVar35;
  uVar44 = (*(uint *)(lVar29 + 0x228) & 0x1f) << 0x14;
  *(uint *)((long)__s + 0x444) = uVar15 & 0xfe000000 | uVar32 | uVar33 | uVar34 | uVar35 | uVar44;
  *(uint *)((long)__s + 0x444) =
       uVar15 & 0xc0000000 | uVar32 | uVar33 | uVar34 | uVar35 | uVar44 |
       (*(uint *)(lVar29 + 0x22c) & 0x1f) << 0x19;
  uVar15 = *(uint *)(lVar29 + 0x230) & 0x1f;
  *(uint *)((long)__s + 0x448) = uVar31 & 0xffffffe0 | uVar15;
  uVar44 = (*(uint *)(lVar29 + 0x234) & 0x1f) << 5;
  *(uint *)((long)__s + 0x448) = uVar31 & 0xffff8000 | uVar15 | uVar44;
  uVar32 = (*(uint *)(lVar29 + 0x238) & 0x1f) << 0xf;
  *(uint *)((long)__s + 0x448) = uVar31 & 0xfff00000 | uVar15 | uVar44 | uVar32;
  uVar33 = (*(uint *)(lVar29 + 0x23c) & 0x1f) << 0x14;
  *(uint *)((long)__s + 0x448) = uVar31 & 0xfe000000 | uVar15 | uVar44 | uVar32 | uVar33;
  *(uint *)((long)__s + 0x448) =
       uVar31 & 0xc0000000 | uVar15 | uVar44 | uVar32 | uVar33 |
       (*(uint *)(lVar29 + 0x240) & 0x1f) << 0x19;
  uVar32 = *(uint *)(lVar29 + 0x244) & 0x1f;
  uVar15 = *(uint *)((long)__s + 0x44c);
  *(uint *)((long)__s + 0x44c) = uVar15 & 0xffffffe0 | uVar32;
  uVar33 = (*(uint *)(lVar29 + 0x248) & 0x1f) << 5;
  *(uint *)((long)__s + 0x44c) = uVar15 & 0xfffffc00 | uVar32 | uVar33;
  uVar31 = (*(uint *)(lVar29 + 0x24c) & 0x1f) << 10;
  *(uint *)((long)__s + 0x44c) = uVar15 & 0xffff8000 | uVar32 | uVar33 | uVar31;
  uVar44 = (*(uint *)(lVar29 + 0x250) & 0x1f) << 0xf;
  *(uint *)((long)__s + 0x44c) = uVar15 & 0xfff00000 | uVar32 | uVar33 | uVar31 | uVar44;
  *(uint *)((long)__s + 0x44c) =
       uVar15 & 0xfe000000 | uVar32 | uVar33 | uVar31 | uVar44 |
       (*(uint *)(lVar29 + 0x254) & 0x1f) << 0x14;
  for (lVar37 = 0; lVar37 != 0x10; lVar37 = lVar37 + 1) {
    *(undefined1 *)((long)__s + lVar37 + 0x434) = *(undefined1 *)(lVar29 + 0x198 + lVar37 * 4);
  }
  puVar28 = (uint *)(lVar30 + 0x314);
  if (iVar17 != 2) {
    puVar28 = (uint *)(lVar30 + 0x328);
  }
  uVar15 = *(uint *)((long)__s + 0x450);
  uVar31 = *puVar28 & 0xf;
  *(uint *)((long)__s + 0x450) = uVar15 & 0xfffffff0 | uVar31;
  uVar44 = (puVar28[1] & 0xf) << 4;
  *(uint *)((long)__s + 0x450) = uVar15 & 0xffffff00 | uVar31 | uVar44;
  uVar32 = (puVar28[2] & 0x1f) << 8;
  *(uint *)((long)__s + 0x450) = uVar15 & 0xffffe000 | uVar31 | uVar44 | uVar32;
  uVar33 = (puVar28[3] & 0x1f) << 0xd;
  *(uint *)((long)__s + 0x450) = uVar15 & 0xfffc0000 | uVar31 | uVar44 | uVar32 | uVar33;
  *(uint *)((long)__s + 0x450) =
       (puVar28[4] & 0x1f) * 0x40000 + (uVar15 & 0xfa800000 | uVar31 | uVar44 | uVar32 | uVar33) +
       0x5000000;
  if (*(long *)((long)hal + 0x3a8) != 0) {
    vepu511_set_osd((Vepu511OsdCfg *)((long)hal + 0x390),(Vepu511Osd *)((long)__s + 0x1428));
  }
  if (*(MppEncROICfg **)((long)hal + 0x388) != (MppEncROICfg *)0x0) {
    vepu511_set_roi((Vepu511RoiCfg *)((long)__s + 0x470),*(MppEncROICfg **)((long)hal + 0x388),
                    *(RK_S32 *)(*(long *)((long)hal + 0x3b0) + 0xc),
                    *(RK_S32 *)(*(long *)((long)hal + 0x3b0) + 0x10));
  }
  iVar17 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x1874);
  *(uint *)((long)__s + 0x294) =
       *(uint *)((long)__s + 0x294) & 0xfffffff8 |
       *(uint *)(*(long *)((long)hal + 0x3b0) + 0x434) & 7;
  if (*(int *)((long)hal + 0x374) == 2) {
    pRVar38 = lambda_tbl_pre_intra;
  }
  else {
    pRVar38 = lambda_tbl_pre_inter;
  }
  memcpy((void *)((long)__s + 0x654),pRVar38,0xd0);
  if (*(int *)((long)hal + 0x374) == 2) {
    pRVar38 = rdo_lambda_table_I;
  }
  else {
    iVar17 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x1878);
    pRVar38 = rdo_lambda_table_P;
  }
  memcpy((void *)((long)__s + 0x754),pRVar38 + iVar17,0xd0);
  *(ulong *)((long)__s + 0x454) = *(ulong *)((long)__s + 0x454) & DAT_002a00e0 | (ulong)DAT_002a00f0
  ;
  *(uint *)((long)__s + 0x45c) = *(uint *)((long)__s + 0x45c) & 0xfffff000 | 0xf0;
  *(uint *)((long)__s + 0x724) = *(uint *)((long)__s + 0x724) & 0xfffffc00 | 0x16b;
  if (((ulong)pEVar9->frm & 4) != 0) {
    uVar16 = *(undefined4 *)(lVar8 + 0x28);
    uVar15 = *(int *)(*(long *)((long)hal + 0x3b0) + 0xc) + 0xfU & 0xfffffff0;
    uVar31 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x10) + 0xfU & 0xfffffff0;
    buffer_00 = (MppBuffer *)((long)hal + 0x430);
    if ((*(long *)((long)hal + 0x430) == 0) &&
       (iVar17 = uVar31 * uVar15,
       mpp_buffer_get_with_tag
                 ((MppBufferGroup)0x0,buffer_00,(long)((iVar17 >> 1) + iVar17),"hal_h265e_v511",
                  "vepu511_h265e_save_pass1_patch"), *buffer_00 == (MppBuffer)0x0)) {
      _mpp_log_l(2,"hal_h265e_v511","buf_pass1 malloc fail, debreath invaild",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0x1b4) = *(byte *)((long)__s + 0x1b4) | 4;
      iVar17 = mpp_buffer_get_fd_with_caller(*buffer_00,"vepu511_h265e_save_pass1_patch");
      *(int *)((long)__s + 0x140) = iVar17;
      *(int *)((long)__s + 0x144) = iVar17;
      *(byte *)((long)__s + 0x1b7) = *(byte *)((long)__s + 0x1b7) | 0x80;
      if ((char)uVar16 < '\0') {
        *(byte *)((long)__s + 0x26e) = *(byte *)((long)__s + 0x26e) & 0xdf;
      }
      mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xa4,uVar31 * uVar15);
      *(byte *)((long)__s + 0x214) = *(byte *)((long)__s + 0x214) & 0xfe;
      *(byte *)((long)__s + 0x1b7) = *(byte *)((long)__s + 0x1b7) & 0xbf;
    }
  }
  if (((ulong)pEVar9->frm & 8) != 0) {
    lVar8 = *(long *)((long)hal + 0x3e0);
    iVar17 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x10);
    uVar15 = *(int *)(*(long *)((long)hal + 0x3b0) + 0xc) + 0xf;
    if ((hal_h265e_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v511","enter\n","vepu511_h265e_use_pass1_patch");
    }
    *(byte *)((long)__s + 0x1b7) = *(byte *)((long)__s + 0x1b7) | 1;
    *(uint *)((long)__s + 0x30) =
         *(uint *)((long)__s + 0x30) & 0xffffff0f | (*(uint *)(lVar8 + 0x10) & 0xf) << 4;
    *(uint *)((long)__s + 0x1cc) = *(uint *)((long)__s + 0x1cc) & 0xffffff40 | 0x98;
    *(ulong *)((long)__s + 0x1e8) =
         *(ulong *)((long)__s + 0x1e8) & (ulong)DAT_002a0670 |
         CONCAT44(uVar15,uVar15) & (ulong)DAT_002a0660;
    *(byte *)((long)__s + 0x1e3) = *(byte *)((long)__s + 0x1e3) & 0xe3;
    iVar21 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x430),"vepu511_h265e_use_pass1_patch");
    *(int *)((long)__s + 0x134) = iVar21;
    *(int *)((long)__s + 0x138) = iVar21;
    MVar22 = mpp_dev_multi_offset_update
                       (*(MppDevRegOffCfgs **)((long)hal + 0x3b8),0xa1,
                        (iVar17 + 0xfU & 0xfffffff0) * (uVar15 & 0xfffffff0));
    if (MVar22 != MPP_OK) {
      _mpp_log_l(2,"hal_h265e_v511","set input cb addr offset failed %d\n",
                 "vepu511_h265e_use_pass1_patch",(ulong)(uint)MVar22);
    }
  }
  *(int *)((long)hal + 0x3fc) = *(int *)((long)hal + 0x3fc) + 1;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0x8bc);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_vepu511_gen_regs(void *hal, HalEncTask *task)
{
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    Vepu511H265eFrmCfg *frm_cfg = ctx->frm;
    H265eV511RegSet *regs = frm_cfg->regs_set;
    MPP_RET ret = MPP_OK;

    HalEncTask *enc_task = task;
    H265eSyntax_new *syn = ctx->syn;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    H265eVepu511Frame *reg_frm = &regs->reg_frm;
    EncFrmStatus *frm = &task->rc_task->frm;

    hal_h265e_enter();

    hal_h265e_dbg_simple("frame %d | type %d | start gen regs11",
                         ctx->frame_num, ctx->frame_type);

    memset(regs, 0, sizeof(H265eV511RegSet));

    vepu511_h265_set_normal(ctx, regs);
    vepu511_h265_set_prep(ctx, task, regs);
    vepu511_h265_set_me_regs(ctx, syn , regs);
    vepu511_h265_set_split(regs, ctx->cfg);
    vepu511_h265_set_hw_address(ctx, reg_frm, task);
    vepu511_h265_set_pp_regs(regs, fmt, &ctx->cfg->prep, task);
    vepu511_h265_set_vsp_filtering(ctx, regs);
    vepu511_h265_set_rc_regs(ctx, regs, task);
    vepu511_h265_set_rdo_regs(regs);
    vepu511_h265_set_quant_regs(ctx, regs);
    vepu511_h265_set_sao_regs(regs);
    vepu511_h265_set_slice_regs(syn, reg_frm);
    vepu511_h265_set_ref_regs(syn, reg_frm);

    ret = vepu511_h265_set_patch_info(syn, (Vepu541Fmt)fmt->format, ctx->reg_cfg, enc_task);
    if (ret)
        return ret;

    setup_vepu511_ext_line_buf(ctx, regs);
    vepu511_h265_set_atf_regs(ctx, regs);
    vepu511_h265_set_anti_stripe_regs(ctx, regs);
    vepu511_h265_set_atr_regs(regs);
    vepu511_h265_set_smear_regs(ctx, regs);
    vepu511_h265_set_scaling_list(regs);
    vepu511_h265_set_aq(ctx, regs);

    if (ctx->osd_cfg.osd_data3)
        vepu511_set_osd(&ctx->osd_cfg, &regs->reg_osd.osd_comb_cfg);

    if (ctx->roi_data)
        vepu511_set_roi(&regs->reg_rc_roi.roi_cfg, ctx->roi_data,
                        ctx->cfg->prep.width, ctx->cfg->prep.height);

    /*paramet cfg*/
    vepu511_h265_global_cfg_set(ctx, regs);

    /* two pass register patch */
    if (frm->save_pass1)
        vepu511_h265e_save_pass1_patch(regs, ctx, syn->pp.tiles_enabled_flag);

    if (frm->use_pass1)
        vepu511_h265e_use_pass1_patch(regs, ctx);

    ctx->frame_num++;

    hal_h265e_leave();
    return MPP_OK;
}